

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O0

void mk_server_listen_exit(mk_list *list)

{
  mk_list *__mptr;
  mk_server_listen *listen;
  mk_list *head;
  mk_list *tmp;
  mk_list *list_local;
  
  if (list != (mk_list *)0x0) {
    listen = (mk_server_listen *)list->next;
    head = *(mk_list **)&(listen->event).mask;
    while (listen != (mk_server_listen *)list) {
      close(*(int *)&listen[-1].protocol);
      mk_list_del((mk_list *)listen);
      mk_mem_free(&listen[-1].event.data);
      listen = (mk_server_listen *)head;
      head = head->next;
    }
    mk_mem_free(list);
  }
  return;
}

Assistant:

void mk_server_listen_exit(struct mk_list *list)
{
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_server_listen *listen;

    if (!list) {
        return;
    }

    mk_list_foreach_safe(head, tmp, list) {
        listen = mk_list_entry(head, struct mk_server_listen, _head);
        mk_event_closesocket(listen->server_fd);
        mk_list_del(&listen->_head);
        mk_mem_free(listen);
    }

    mk_mem_free(list);
}